

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O0

void __thiscall
Assimp::HMPImporter::InternReadFile
          (HMPImporter *this,string *pFile,aiScene *_pScene,IOSystem *_pIOHandler)

{
  IOSystem *this_00;
  aiScene *paVar1;
  int iVar2;
  IOStream *__p;
  pointer pIVar3;
  DeadlyImportError *pDVar4;
  undefined4 extraout_var;
  uchar *puVar5;
  Logger *pLVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  char local_e5;
  undefined1 local_e4;
  undefined1 local_e3;
  char local_e2;
  undefined1 local_e1;
  char cStack_e0;
  undefined1 uStack_df;
  undefined1 uStack_de;
  char szBuffer [5];
  uint32_t iMagic;
  ulong local_b8;
  size_t fileSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *_pIOHandler_local;
  aiScene *_pScene_local;
  string *pFile_local;
  HMPImporter *this_local;
  
  (this->super_MDLImporter).pScene = _pScene;
  (this->super_MDLImporter).pIOHandler = _pIOHandler;
  this_00 = (this->super_MDLImporter).pIOHandler;
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       _pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(this_00,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar3 == (pointer)0x0) {
    fileSize._7_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open HMP file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar4,&local_88);
    fileSize._7_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  iVar2 = (*pIVar3->_vptr_IOStream[6])();
  local_b8 = CONCAT44(extraout_var,iVar2);
  if (0x31 < local_b8) {
    puVar5 = (uchar *)operator_new__(local_b8);
    (this->super_MDLImporter).mBuffer = puVar5;
    pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_30);
    (*pIVar3->_vptr_IOStream[2])(pIVar3,(this->super_MDLImporter).mBuffer,1,local_b8);
    (this->super_MDLImporter).iFileSize = (uint)local_b8;
    iVar2 = *(int *)(this->super_MDLImporter).mBuffer;
    _cStack_e0 = iVar2;
    if ((iVar2 == 0x34504d48) || (iVar2 == 0x484d5034)) {
      pLVar6 = DefaultLogger::get();
      Logger::debug(pLVar6,"HMP subtype: 3D GameStudio A4, magic word is HMP4");
      InternReadFile_HMP4(this);
    }
    else if ((iVar2 == 0x35504d48) || (iVar2 == 0x484d5035)) {
      pLVar6 = DefaultLogger::get();
      Logger::debug(pLVar6,"HMP subtype: 3D GameStudio A5, magic word is HMP5");
      InternReadFile_HMP5(this);
    }
    else {
      if ((iVar2 != 0x37504d48) && (iVar2 != 0x484d5037)) {
        cStack_e0 = (char)iVar2;
        local_e5 = cStack_e0;
        uStack_df = (undefined1)((uint)iVar2 >> 8);
        local_e4 = uStack_df;
        uStack_de = (undefined1)((uint)iVar2 >> 0x10);
        local_e3 = uStack_de;
        szBuffer[0] = (char)((uint)iVar2 >> 0x18);
        local_e2 = szBuffer[0];
        local_e1 = 0;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_168,"Unknown HMP subformat ",pFile);
        std::operator+(&local_148,&local_168,". Magic word (");
        std::operator+(&local_128,&local_148,&local_e5);
        std::operator+(&local_108,&local_128,") is not known");
        DeadlyImportError::DeadlyImportError(pDVar4,&local_108);
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      pLVar6 = DefaultLogger::get();
      Logger::debug(pLVar6,"HMP subtype: 3D GameStudio A7, magic word is HMP7");
      InternReadFile_HMP7(this);
    }
    paVar1 = (this->super_MDLImporter).pScene;
    paVar1->mFlags = paVar1->mFlags | 0x10;
    puVar5 = (this->super_MDLImporter).mBuffer;
    if (puVar5 != (uchar *)0x0) {
      operator_delete__(puVar5);
    }
    (this->super_MDLImporter).mBuffer = (uchar *)0x0;
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_30);
    return;
  }
  szBuffer[3] = '\x01';
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&iMagic,"HMP File is too small.",(allocator *)(szBuffer + 4));
  DeadlyImportError::DeadlyImportError(pDVar4,(string *)&iMagic);
  szBuffer[3] = '\0';
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void HMPImporter::InternReadFile( const std::string& pFile,
                                 aiScene* _pScene, IOSystem* _pIOHandler)
{
    pScene     = _pScene;
    pIOHandler = _pIOHandler;
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open HMP file " + pFile + ".");

    // Check whether the HMP file is large enough to contain
    // at least the file header
    const size_t fileSize = file->FileSize();
    if( fileSize < 50)
        throw DeadlyImportError( "HMP File is too small.");

    // Allocate storage and copy the contents of the file to a memory buffer
    mBuffer = new uint8_t[fileSize];
    file->Read( (void*)mBuffer, 1, fileSize);
    iFileSize = (unsigned int)fileSize;

    // Determine the file subtype and call the appropriate member function
    const uint32_t iMagic = *((uint32_t*)this->mBuffer);

    // HMP4 format
    if (AI_HMP_MAGIC_NUMBER_LE_4 == iMagic ||
        AI_HMP_MAGIC_NUMBER_BE_4 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A4, magic word is HMP4");
        InternReadFile_HMP4();
    }
    // HMP5 format
    else if (AI_HMP_MAGIC_NUMBER_LE_5 == iMagic ||
             AI_HMP_MAGIC_NUMBER_BE_5 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A5, magic word is HMP5");
        InternReadFile_HMP5();
    }
    // HMP7 format
    else if (AI_HMP_MAGIC_NUMBER_LE_7 == iMagic ||
             AI_HMP_MAGIC_NUMBER_BE_7 == iMagic)
    {
        ASSIMP_LOG_DEBUG("HMP subtype: 3D GameStudio A7, magic word is HMP7");
        InternReadFile_HMP7();
    }
    else
    {
        // Print the magic word to the logger
        char szBuffer[5];
        szBuffer[0] = ((char*)&iMagic)[0];
        szBuffer[1] = ((char*)&iMagic)[1];
        szBuffer[2] = ((char*)&iMagic)[2];
        szBuffer[3] = ((char*)&iMagic)[3];
        szBuffer[4] = '\0';

        // We're definitely unable to load this file
        throw DeadlyImportError( "Unknown HMP subformat " + pFile +
            ". Magic word (" + szBuffer + ") is not known");
    }

    // Set the AI_SCENE_FLAGS_TERRAIN bit
    pScene->mFlags |= AI_SCENE_FLAGS_TERRAIN;

    delete[] mBuffer;
    mBuffer= nullptr;

}